

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O1

int64_t yactfr::internal::anon_unknown_0::readFlSIntLe39At1(uint8_t *buf)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar2 = (ulong)((uint)(*buf >> 1) | (uint)buf[1] << 7) |
          (ulong)buf[2] << 0xf | (ulong)buf[3] << 0x17 | (ulong)buf[4] << 0x1f;
  uVar1 = uVar2 | 0xffffff8000000000;
  if (-1 < (char)buf[4]) {
    uVar1 = uVar2;
  }
  return uVar1;
}

Assistant:

std::int64_t readFlSIntLe39At1(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[4];
    res <<= 8;
    res |= buf[3];
    res <<= 8;
    res |= buf[2];
    res <<= 8;
    res |= buf[1];
    res <<= 7;
    res |= (buf[0] >> 1);
    res &= UINT64_C(0x7fffffffff);

    if (res >> 38) {
        res |= UINT64_C(0xffffff8000000000);
    }

    return static_cast<std::int64_t>(res);
}